

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O2

void __thiscall
icu_63::ServiceEnumeration::ServiceEnumeration
          (ServiceEnumeration *this,ICULocaleService *service,UErrorCode *status)

{
  int32_t iVar1;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__ServiceEnumeration_003a12d0;
  this->_service = service;
  iVar1 = ICUService::getTimestamp(&service->super_ICUService);
  this->_timestamp = iVar1;
  UVector::UVector(&this->_ids,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,status);
  this->_pos = 0;
  ICUService::getVisibleIDs(&this->_service->super_ICUService,&this->_ids,status);
  return;
}

Assistant:

ServiceEnumeration(const ICULocaleService* service, UErrorCode &status)
        : _service(service)
        , _timestamp(service->getTimestamp())
        , _ids(uprv_deleteUObject, NULL, status)
        , _pos(0)
    {
        _service->getVisibleIDs(_ids, status);
    }